

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

Enum xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  Enum EVar4;
  void *pvVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  undefined8 *puVar14;
  ArrayBase *pAVar15;
  uint32_t uVar16;
  char *__function;
  uint uVar17;
  uint32_t i;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  Enum EVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  UvMeshDecl *pUVar25;
  uint32_t j;
  Atlas *pAVar26;
  float fVar27;
  float fVar28;
  uint32_t face2;
  UvMesh *mesh;
  UvMeshChart *chart;
  UvMeshInstance *meshInstance;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  vertexToFaceMap;
  BitArray faceAssigned;
  uint local_f4;
  undefined8 *local_f0;
  uint local_e4;
  ArrayBase *local_e0;
  long *local_d8;
  ulong local_d0;
  UvMeshDecl *local_c8;
  Atlas *local_c0;
  long *local_b8;
  uint local_ac;
  ArrayBase *local_a8;
  ulong local_a0;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  local_98;
  BitArray local_50;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x22bb,"AddMeshError::Enum xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[1].width == 0) {
    uVar18 = decl->indexCount;
    uVar17 = decl->vertexCount;
    if (uVar18 != 0) {
      uVar17 = uVar18;
    }
    uVar20 = (ulong)uVar17;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",
                 *(undefined4 *)&atlas[4].field_0x14,decl->vertexCount,uVar20 / 3);
    }
    EVar21 = InvalidIndexCount;
    if (uVar17 * -0x55555555 < 0x55555556) {
      if (uVar17 != 0 && uVar18 != 0) {
        pvVar5 = decl->indexData;
        if (pvVar5 == (void *)0x0) {
LAB_001a50f0:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x2203,
                        "uint32_t xatlas::DecodeIndex(IndexFormat::Enum, const void *, int32_t, uint32_t)"
                       );
        }
        uVar22 = 0;
        do {
          if (decl->indexFormat == UInt16) {
            uVar23 = (uint)(ushort)(*(short *)((long)pvVar5 + uVar22 * 2) + (short)decl->indexOffset
                                   );
          }
          else {
            uVar23 = *(int *)((long)pvVar5 + uVar22 * 4) + decl->indexOffset;
          }
          if (decl->vertexCount <= uVar23) {
            return IndexOutOfRange;
          }
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      plVar13 = (long *)(*(code *)internal::s_realloc)(0,0x28);
      if (plVar13 == (long *)0x0) {
LAB_001a510f:
        __assert_fail("mem",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x154,
                      "void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)");
      }
      plVar13[2] = 0;
      plVar13[3] = 0;
      *plVar13 = 0;
      plVar13[1] = 0;
      plVar13[4] = 0;
      plVar13[2] = 8;
      *(undefined4 *)(plVar13 + 3) = 0;
      uVar16 = decl->vertexCount;
      *(uint32_t *)((long)plVar13 + 0x14) = uVar16;
      local_d8 = plVar13;
      if (uVar16 != 0) {
        internal::ArrayBase::setArrayCapacity((ArrayBase *)(plVar13 + 1),uVar16);
      }
      uVar23 = decl->vertexCount;
      if ((ulong)uVar23 != 0) {
        uVar3 = *(uint *)((long)local_d8 + 0x14);
        pvVar5 = decl->vertexUvData;
        uVar16 = decl->vertexStride;
        uVar24 = 0;
        uVar22 = 0;
        do {
          if (uVar3 == uVar22) goto LAB_001a50b2;
          fVar1 = *(float *)((long)pvVar5 + (ulong)uVar24);
          fVar2 = *(float *)((long)pvVar5 + (ulong)uVar24 + 4);
          fVar27 = 0.0;
          fVar28 = 0.0;
          if (!NAN(fVar1) && !NAN(fVar2)) {
            fVar27 = fVar1;
            fVar28 = fVar2;
          }
          lVar19 = local_d8[1];
          *(float *)(lVar19 + uVar22 * 8) = fVar27;
          *(float *)(lVar19 + 4 + uVar22 * 8) = fVar28;
          uVar22 = uVar22 + 1;
          uVar24 = uVar24 + uVar16;
        } while (uVar23 != uVar22);
      }
      local_d0 = CONCAT44(local_d0._4_4_,uVar17);
      local_b8 = local_d8;
      *(bool *)(local_d8 + 4) = decl->rotateCharts;
      local_f0 = (undefined8 *)0x0;
      local_a8 = (ArrayBase *)&atlas[4].atlasCount;
      uVar23 = *(uint *)&atlas[4].field_0x14;
      local_c8 = decl;
      local_c0 = atlas;
      if ((ulong)uVar23 != 0) {
        lVar19 = *(long *)local_a8;
        uVar22 = 0;
        do {
          puVar14 = *(undefined8 **)(lVar19 + uVar22 * 8);
          iVar12 = bcmp(puVar14,local_c8,0x38);
          if (iVar12 == 0) {
            *local_b8 = (long)puVar14;
            local_f0 = puVar14;
            break;
          }
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
      pAVar26 = local_c0;
      if (local_f0 == (undefined8 *)0x0) {
        puVar14 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x80);
        pUVar25 = local_c8;
        if (puVar14 == (undefined8 *)0x0) goto LAB_001a510f;
        puVar14[6] = 0;
        puVar14[7] = 0;
        puVar14[8] = 0;
        puVar14[9] = 0;
        puVar14[10] = 0;
        puVar14[0xb] = 0;
        puVar14[0xc] = 0;
        puVar14[0xd] = 0;
        puVar14[0xe] = 0;
        puVar14[0xf] = 0;
        puVar14[4] = 0;
        puVar14[5] = 0;
        puVar14[2] = 0;
        puVar14[3] = 0;
        *puVar14 = 0;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 6) = 1;
        puVar14[7] = 0;
        puVar14[8] = 4;
        *(undefined4 *)(puVar14 + 9) = 0;
        puVar14[10] = 0;
        puVar14[0xb] = 8;
        *(undefined4 *)(puVar14 + 0xc) = 0;
        puVar14[0xd] = 0;
        puVar14[0xe] = 4;
        *(undefined4 *)(puVar14 + 0xf) = 0;
        *local_d8 = (long)puVar14;
        *(bool *)(puVar14 + 6) = local_c8->rotateCharts;
        uVar7 = *(undefined8 *)local_c8;
        pvVar5 = local_c8->vertexUvData;
        uVar8 = *(undefined8 *)&local_c8->indexCount;
        pvVar9 = local_c8->indexData;
        puVar6 = local_c8->faceMaterialData;
        puVar14[4] = *(undefined8 *)&local_c8->indexOffset;
        puVar14[5] = puVar6;
        puVar14[2] = uVar8;
        puVar14[3] = pvVar9;
        *puVar14 = uVar7;
        puVar14[1] = pvVar5;
        uVar23 = local_c8->indexCount;
        *(uint *)((long)puVar14 + 0x44) = uVar23;
        local_f0 = puVar14;
        if (*(uint *)(puVar14 + 9) < uVar23) {
          internal::ArrayBase::setArrayCapacity((ArrayBase *)(puVar14 + 7),uVar23);
        }
        pAVar26 = local_c0;
        if ((uint32_t)local_d0 != 0) {
          pvVar5 = pUVar25->indexData;
          EVar4 = pUVar25->indexFormat;
          uVar22 = 0;
          do {
            if (uVar18 == 0) {
              uVar23 = (uint)uVar22;
            }
            else {
              if (pvVar5 == (void *)0x0) goto LAB_001a50f0;
              if (EVar4 == UInt16) {
                uVar23 = (uint)(ushort)((short)pUVar25->indexOffset +
                                       *(short *)((long)pvVar5 + uVar22 * 2));
              }
              else {
                uVar23 = pUVar25->indexOffset + *(int *)((long)pvVar5 + uVar22 * 4);
              }
            }
            if (*(uint *)((long)local_f0 + 0x44) <= uVar22) goto LAB_001a509b;
            *(uint *)(local_f0[7] + uVar22 * 4) = uVar23;
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        uVar18 = pUVar25->vertexCount;
        *(uint *)((long)local_f0 + 0x74) = uVar18;
        if (*(uint *)(local_f0 + 0xf) < uVar18) {
          internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_f0 + 0xd),uVar18);
        }
        if (*(int *)((long)local_f0 + 0x74) != 0) {
          lVar19 = local_f0[0xd];
          uVar22 = 0;
          do {
            *(undefined4 *)(lVar19 + uVar22 * 4) = 0xffffffff;
            uVar22 = uVar22 + 1;
          } while (uVar22 < *(uint *)((long)local_f0 + 0x74));
        }
        local_98.m_memTag = 0;
        local_98.m_size = (uint32_t)local_d0;
        local_98.m_numSlots = 0;
        local_98.m_slots = (uint32_t *)0x0;
        local_98.m_keys.m_base.buffer = (uint8_t *)0x0;
        local_98.m_keys.m_base.elementSize = 8;
        local_98.m_keys.m_base.size = 0;
        local_98.m_keys.m_base.capacity = 0;
        local_98.m_next.m_base.buffer = (uint8_t *)0x0;
        local_98.m_next.m_base.elementSize = 4;
        local_98.m_next.m_base.size = 0;
        local_98.m_next.m_base.capacity = 0;
        if ((uint32_t)local_d0 != 0) {
          lVar19 = 0;
          do {
            if (*(uint *)((long)local_f0 + 0x44) <= (uint)lVar19) goto LAB_001a509b;
            uVar18 = *(uint *)(local_f0[7] + lVar19 * 4);
            if (*(uint *)((long)local_d8 + 0x14) <= uVar18) goto LAB_001a50b2;
            internal::
            HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
            ::add(&local_98,(Vector2 *)((ulong)uVar18 * 8 + local_d8[1]));
            lVar19 = lVar19 + 1;
          } while (uVar17 != (uint)lVar19);
        }
        uVar20 = uVar20 / 3;
        internal::BitArray::BitArray(&local_50,uVar17 / 3);
        memset(local_50.m_wordArray.m_base.buffer,0,
               (ulong)(local_50.m_wordArray.m_base.size * local_50.m_wordArray.m_base.elementSize));
        local_e4 = 0;
        if (2 < (uint32_t)local_d0) {
          local_a0 = uVar20;
          do {
            bVar10 = internal::BitArray::get(&local_50,local_e4);
            if (!bVar10) {
              pAVar15 = (ArrayBase *)(*(code *)internal::s_realloc)(0,0x38);
              if (pAVar15 == (ArrayBase *)0x0) goto LAB_001a510f;
              pAVar15->buffer = (uint8_t *)0x0;
              pAVar15->elementSize = 0;
              pAVar15->size = 0;
              *(undefined8 *)&pAVar15->capacity = 0;
              pAVar15[1].buffer = (uint8_t *)0x0;
              pAVar15[1].elementSize = 0;
              pAVar15[1].size = 0;
              *(undefined8 *)&pAVar15[1].capacity = 0;
              uVar16 = 0;
              pAVar15[2].buffer = (uint8_t *)0x0;
              pAVar15->elementSize = 4;
              pAVar15->size = 0;
              pAVar15->capacity = 0;
              pAVar15[1].buffer = (uint8_t *)0x0;
              pAVar15[1].elementSize = 4;
              pAVar15[1].size = 0;
              pAVar15[1].capacity = 0;
              if (pUVar25->faceMaterialData != (uint32_t *)0x0) {
                uVar16 = pUVar25->faceMaterialData[local_e4];
              }
              *(uint32_t *)&pAVar15[2].buffer = uVar16;
              local_e0 = pAVar15;
              internal::BitArray::set(&local_50,local_e4);
              internal::ArrayBase::push_back(local_e0,(uint8_t *)&local_e4);
              do {
                local_ac = local_e0->size;
                if (local_ac == 0) break;
                uVar20 = 0;
                bVar10 = false;
                do {
                  if (local_e0->size <= (uint)uVar20) goto LAB_001a509b;
                  local_b8 = (long *)CONCAT44(local_b8._4_4_,(uint)uVar20);
                  uVar18 = *(uint *)(local_e0->buffer + uVar20 * 4);
                  local_d0 = (ulong)(uVar18 * 3);
                  lVar19 = 0;
                  do {
                    uVar17 = (int)local_d0 + (int)lVar19;
                    if (*(uint *)(*local_d8 + 0x44) <= uVar17) goto LAB_001a509b;
                    uVar17 = *(uint *)(*(long *)(*local_d8 + 0x38) + (ulong)uVar17 * 4);
                    if (*(uint *)((long)local_d8 + 0x14) <= uVar17) goto LAB_001a50b2;
                    for (uVar17 = internal::
                                  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                  ::get(&local_98,(Vector2 *)((ulong)uVar17 * 8 + local_d8[1]));
                        uVar17 != 0xffffffff;
                        uVar17 = internal::
                                 HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                 ::getNext(&local_98,uVar17)) {
                      local_f4 = uVar17 / 3;
                      bVar11 = internal::BitArray::get(&local_50,local_f4);
                      if ((!bVar11) &&
                         ((puVar6 = local_c8->faceMaterialData, puVar6 == (uint32_t *)0x0 ||
                          (puVar6[uVar18] == puVar6[local_f4])))) {
                        internal::BitArray::set(&local_50,local_f4);
                        bVar10 = true;
                        internal::ArrayBase::push_back(local_e0,(uint8_t *)&local_f4);
                      }
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  uVar20 = (ulong)((int)local_b8 + 1U);
                } while ((int)local_b8 + 1U != local_ac);
              } while (bVar10);
              pUVar25 = local_c8;
              if (local_e0->size != 0) {
                uVar18 = 0;
                do {
                  iVar12 = 0;
                  do {
                    if (local_e0->size <= uVar18) goto LAB_001a509b;
                    uVar17 = *(int *)(local_e0->buffer + (ulong)uVar18 * 4) * 3 + iVar12;
                    if (*(uint *)(*local_d8 + 0x44) <= uVar17) goto LAB_001a509b;
                    local_f4 = *(uint *)(*(long *)(*local_d8 + 0x38) + (ulong)uVar17 * 4);
                    internal::ArrayBase::push_back(local_e0 + 1,(uint8_t *)&local_f4);
                    if (*(uint *)((long)local_f0 + 0x74) <= local_f4) goto LAB_001a509b;
                    *(undefined4 *)(local_f0[0xd] + (ulong)local_f4 * 4) =
                         *(undefined4 *)((long)local_f0 + 0x5c);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 != 3);
                  uVar18 = uVar18 + 1;
                } while (uVar18 < local_e0->size);
              }
              internal::ArrayBase::push_back((ArrayBase *)(local_f0 + 10),(uint8_t *)&local_e0);
              uVar20 = local_a0;
              pAVar26 = local_c0;
            }
            local_e4 = local_e4 + 1;
          } while (local_e4 < (uint)uVar20);
        }
        internal::ArrayBase::push_back(local_a8,(uint8_t *)&local_f0);
        internal::ArrayBase::~ArrayBase(&local_50.m_wordArray.m_base);
        internal::
        HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
        ::~HashMap(&local_98);
      }
      else if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
        (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
      }
      if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
        (*(code *)internal::s_print)("   %u charts\n",*(undefined4 *)(*local_d8 + 0x5c));
      }
      internal::ArrayBase::push_back((ArrayBase *)&pAVar26[4].utilization,(uint8_t *)&local_d8);
      EVar21 = Success;
    }
  }
  else {
    EVar21 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar21;
LAB_001a50b2:
  __function = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
  goto LAB_001a50c7;
LAB_001a509b:
  __function = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
LAB_001a50c7:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4ae,__function);
}

Assistant:

AddMeshError::Enum AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (ctx->meshCount > 0) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
	const bool decoded = (decl.indexCount <= 0);
	const uint32_t indexCount = decoded ? decl.vertexCount : decl.indexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (!decoded) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->texcoords.resize(decl.vertexCount);
	for (uint32_t i = 0; i < decl.vertexCount; i++) {
		internal::Vector2 texcoord = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Set nan values to 0.
		if (internal::isNan(texcoord.x) || internal::isNan(texcoord.y))
			texcoord.x = texcoord.y = 0.0f;
		meshInstance->texcoords[i] = texcoord;
	}
	meshInstance->rotateCharts = decl.rotateCharts;
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			meshInstance->mesh = mesh = ctx->uvMeshes[m];
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		meshInstance->mesh = mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		mesh->decl = decl;
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = decoded ? i : DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
		mesh->vertexToChartMap.resize(decl.vertexCount);
		for (uint32_t i = 0; i < mesh->vertexToChartMap.size(); i++)
			mesh->vertexToChartMap[i] = UINT32_MAX;
		// Calculate charts (incident faces).
		internal::HashMap<internal::Vector2> vertexToFaceMap(internal::MemTag::Default, indexCount); // Face is index / 3
		const uint32_t faceCount = indexCount / 3;
		for (uint32_t i = 0; i < indexCount; i++)
			vertexToFaceMap.add(meshInstance->texcoords[mesh->indices[i]]);
		internal::BitArray faceAssigned(faceCount);
		faceAssigned.zeroOutMemory();
		for (uint32_t f = 0; f < faceCount; f++) {
			if (faceAssigned.get(f))
				continue;
			// Found an unassigned face, create a new chart.
			internal::UvMeshChart *chart = XA_NEW(internal::MemTag::Default, internal::UvMeshChart);
			chart->material = decl.faceMaterialData ? decl.faceMaterialData[f] : 0;
			// Walk incident faces and assign them to the chart.
			faceAssigned.set(f);
			chart->faces.push_back(f);
			for (;;) {
				bool newFaceAssigned = false;
				const uint32_t faceCount2 = chart->faces.size();
				for (uint32_t f2 = 0; f2 < faceCount2; f2++) {
					const uint32_t face = chart->faces[f2];
					for (uint32_t i = 0; i < 3; i++) {
						const internal::Vector2 &texcoord = meshInstance->texcoords[meshInstance->mesh->indices[face * 3 + i]];
						uint32_t mapIndex = vertexToFaceMap.get(texcoord);
						while (mapIndex != UINT32_MAX) {
							const uint32_t face2 = mapIndex / 3; // 3 vertices added per face.
							// Materials must match.
							if (!faceAssigned.get(face2) && (!decl.faceMaterialData || decl.faceMaterialData[face] == decl.faceMaterialData[face2])) {
								faceAssigned.set(face2);
								chart->faces.push_back(face2);
								newFaceAssigned = true;
							}
							mapIndex = vertexToFaceMap.getNext(mapIndex);
						}
					}
				}
				if (!newFaceAssigned)
					break;
			}
			for (uint32_t i = 0; i < chart->faces.size(); i++) {
				for (uint32_t j = 0; j < 3; j++) {
					const uint32_t vertex = meshInstance->mesh->indices[chart->faces[i] * 3 + j];
					chart->indices.push_back(vertex);
					mesh->vertexToChartMap[vertex] = mesh->charts.size();
				}
			}
			mesh->charts.push_back(chart);
		}
		ctx->uvMeshes.push_back(mesh);
	} else {
		XA_PRINT("   instance of a previous UV mesh\n");
	}
	XA_PRINT("   %u charts\n", meshInstance->mesh->charts.size());
	ctx->uvMeshInstances.push_back(meshInstance);
	return AddMeshError::Success;
}